

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

void tinyusdz::tydra::anon_unknown_0::detail::DumpSkelNode
               (stringstream *ss,SkelNode *node,uint32_t indent)

{
  string *psVar1;
  SkelNode *s;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_> *this;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  uint32_t extraout_EDX;
  uint32_t n_05;
  matrix4d *v;
  matrix4d *v_00;
  string local_258;
  string local_238;
  reference local_218;
  SkelNode *child;
  const_iterator __end4;
  const_iterator __begin4;
  vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_> *__range4;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  allocator local_149;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  uint32_t local_1c;
  SkelNode *pSStack_18;
  uint32_t indent_local;
  SkelNode *node_local;
  stringstream *ss_local;
  
  local_1c = indent;
  pSStack_18 = node;
  node_local = (SkelNode *)ss;
  pprint::Indent_abi_cxx11_(&local_40,(pprint *)(ulong)indent,indent);
  poVar3 = ::std::operator<<((ostream *)(ss + 0x10),(string *)&local_40);
  poVar3 = ::std::operator<<(poVar3,(string *)&pSStack_18->joint_name);
  ::std::operator<<(poVar3," {\n");
  ::std::__cxx11::string::~string((string *)&local_40);
  psVar1 = &node_local->joint_path;
  pprint::Indent_abi_cxx11_(&local_60,(pprint *)(ulong)(local_1c + 1),n);
  poVar3 = ::std::operator<<((ostream *)(psVar1->field_2)._M_local_buf,(string *)&local_60);
  poVar3 = ::std::operator<<(poVar3,"joint_path ");
  s = pSStack_18;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_a0,"\"",&local_a1);
  quote(&local_80,&s->joint_path,&local_a0);
  poVar3 = ::std::operator<<(poVar3,(string *)&local_80);
  ::std::operator<<(poVar3,"\n");
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  ::std::__cxx11::string::~string((string *)&local_60);
  psVar1 = &node_local->joint_path;
  pprint::Indent_abi_cxx11_(&local_c8,(pprint *)(ulong)(local_1c + 1),n_00);
  poVar3 = ::std::operator<<((ostream *)(psVar1->field_2)._M_local_buf,(string *)&local_c8);
  poVar3 = ::std::operator<<(poVar3,"joint_id ");
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,pSStack_18->joint_id);
  ::std::operator<<(poVar3,"\n");
  ::std::__cxx11::string::~string((string *)&local_c8);
  psVar1 = &node_local->joint_path;
  pprint::Indent_abi_cxx11_(&local_e8,(pprint *)(ulong)(local_1c + 1),n_01);
  poVar3 = ::std::operator<<((ostream *)(psVar1->field_2)._M_local_buf,(string *)&local_e8);
  poVar3 = ::std::operator<<(poVar3,"bind_transform ");
  tinyusdz::to_string_abi_cxx11_(&local_128,(tinyusdz *)&pSStack_18->bind_transform,v);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_148,"\"",&local_149);
  quote(&local_108,&local_128,&local_148);
  poVar3 = ::std::operator<<(poVar3,(string *)&local_108);
  ::std::operator<<(poVar3,"\n");
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_148);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_149);
  ::std::__cxx11::string::~string((string *)&local_128);
  ::std::__cxx11::string::~string((string *)&local_e8);
  psVar1 = &node_local->joint_path;
  pprint::Indent_abi_cxx11_(&local_170,(pprint *)(ulong)(local_1c + 1),n_02);
  poVar3 = ::std::operator<<((ostream *)(psVar1->field_2)._M_local_buf,(string *)&local_170);
  poVar3 = ::std::operator<<(poVar3,"rest_transform ");
  tinyusdz::to_string_abi_cxx11_(&local_1b0,(tinyusdz *)&pSStack_18->rest_transform,v_00);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1d0,"\"",&local_1d1);
  quote(&local_190,&local_1b0,&local_1d0);
  poVar3 = ::std::operator<<(poVar3,(string *)&local_190);
  ::std::operator<<(poVar3,"\n");
  ::std::__cxx11::string::~string((string *)&local_190);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  ::std::__cxx11::string::~string((string *)&local_1b0);
  ::std::__cxx11::string::~string((string *)&local_170);
  sVar4 = ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::size
                    (&pSStack_18->children);
  n_05 = n_03;
  if (sVar4 != 0) {
    psVar1 = &node_local->joint_path;
    pprint::Indent_abi_cxx11_((string *)&__range4,(pprint *)(ulong)(local_1c + 1),n_03);
    poVar3 = ::std::operator<<((ostream *)(psVar1->field_2)._M_local_buf,(string *)&__range4);
    ::std::operator<<(poVar3,"children {\n");
    ::std::__cxx11::string::~string((string *)&__range4);
    this = &pSStack_18->children;
    __end4 = ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::
             begin(this);
    child = (SkelNode *)
            ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::
            end(this);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end4,(__normal_iterator<const_tinyusdz::tydra::SkelNode_*,_std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>_>
                                  *)&child);
      if (!bVar2) break;
      local_218 = __gnu_cxx::
                  __normal_iterator<const_tinyusdz::tydra::SkelNode_*,_std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>_>
                  ::operator*(&__end4);
      DumpSkelNode((stringstream *)node_local,local_218,local_1c + 2);
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::tydra::SkelNode_*,_std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>_>
      ::operator++(&__end4);
    }
    psVar1 = &node_local->joint_path;
    pprint::Indent_abi_cxx11_(&local_238,(pprint *)(ulong)(local_1c + 1),n_04);
    poVar3 = ::std::operator<<((ostream *)(psVar1->field_2)._M_local_buf,(string *)&local_238);
    ::std::operator<<(poVar3,"}\n");
    ::std::__cxx11::string::~string((string *)&local_238);
    n_05 = extraout_EDX;
  }
  psVar1 = &node_local->joint_path;
  pprint::Indent_abi_cxx11_(&local_258,(pprint *)(ulong)local_1c,n_05);
  poVar3 = ::std::operator<<((ostream *)(psVar1->field_2)._M_local_buf,(string *)&local_258);
  ::std::operator<<(poVar3,"}\n");
  ::std::__cxx11::string::~string((string *)&local_258);
  return;
}

Assistant:

void DumpSkelNode(std::stringstream &ss, const SkelNode &node, uint32_t indent) {

  ss << pprint::Indent(indent) << node.joint_name << " {\n";

  ss << pprint::Indent(indent + 1) << "joint_path " << quote(node.joint_path) << "\n";
  ss << pprint::Indent(indent + 1) << "joint_id " << node.joint_id << "\n";
  ss << pprint::Indent(indent + 1) << "bind_transform " << quote(tinyusdz::to_string(node.bind_transform)) << "\n";
  ss << pprint::Indent(indent + 1) << "rest_transform " << quote(tinyusdz::to_string(node.rest_transform)) << "\n";

  if (node.children.size()) {
    ss << pprint::Indent(indent + 1) << "children {\n";
    for (const auto &child : node.children) {
      DumpSkelNode(ss, child, indent + 2);
    }
    ss << pprint::Indent(indent + 1) << "}\n";
  }

  ss << pprint::Indent(indent) << "}\n";
}